

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void vmaCalculatePoolStatistics
               (VmaAllocator allocator,VmaPool pool,VmaDetailedStatistics *pPoolStats)

{
  VmaPool in_RDX;
  VmaAllocator_T *in_RSI;
  
  VmaAllocator_T::CalculatePoolStatistics(in_RSI,in_RDX,(VmaDetailedStatistics *)0x3027a5);
  return;
}

Assistant:

VMA_CALL_PRE void VMA_CALL_POST vmaCalculatePoolStatistics(
    VmaAllocator allocator,
    VmaPool pool,
    VmaDetailedStatistics* pPoolStats)
{
    VMA_ASSERT(allocator && pool && pPoolStats);

    VMA_DEBUG_GLOBAL_MUTEX_LOCK

    allocator->CalculatePoolStatistics(pool, pPoolStats);
}